

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O1

string * __thiscall
BigSudokuVisualizer::createBorderBottomStyle_abi_cxx11_
          (string *__return_storage_ptr__,BigSudokuVisualizer *this,SudokuGitter *gitter)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  string __str;
  char *local_68;
  uint local_60;
  char local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ulong local_40;
  SudokuGitter *local_38;
  
  uVar6 = gitter->elements;
  uVar5 = gitter->quadHeight;
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  local_38 = gitter;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar5 = uVar5 - 1;
  uVar4 = (ulong)uVar6;
  if (uVar5 < uVar6) {
    do {
      local_40 = uVar4;
      uVar6 = uVar5 * (int)local_40;
      uVar7 = (int)local_40 + uVar6;
      if (uVar6 < uVar7) {
        do {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar2 = '\x01';
          if (9 < uVar6) {
            uVar4 = (ulong)uVar6;
            cVar1 = '\x04';
            do {
              cVar2 = cVar1;
              uVar3 = (uint)uVar4;
              if (uVar3 < 100) {
                cVar2 = cVar2 + -2;
                goto LAB_001132da;
              }
              if (uVar3 < 1000) {
                cVar2 = cVar2 + -1;
                goto LAB_001132da;
              }
              if (uVar3 < 10000) goto LAB_001132da;
              uVar4 = uVar4 / 10000;
              cVar1 = cVar2 + '\x04';
            } while (99999 < uVar3);
            cVar2 = cVar2 + '\x01';
          }
LAB_001132da:
          local_68 = local_58;
          std::__cxx11::string::_M_construct((ulong)&local_68,cVar2);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_68,local_60,uVar6);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar7);
      }
      uVar5 = uVar5 + local_38->quadHeight;
      uVar4 = local_40;
    } while (uVar5 < (uint)local_40);
  }
  std::__cxx11::string::substr((ulong)&local_68,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string BigSudokuVisualizer::createBorderBottomStyle(SudokuGitter gitter) {
    unsigned int size = gitter.getElements();
    unsigned int h = gitter.getQuadHeight() - 1;
    std::string border_bottom = "";
    while (h < size) {
        unsigned int iStart = h * size;
        for (unsigned int i = iStart; i < iStart + size; i++) {
            border_bottom.append("#bigCell-");
            border_bottom.append(std::to_string(i));
            border_bottom.append(", ");
        }
        h += gitter.getQuadHeight();
    }
    border_bottom = border_bottom.substr(0, border_bottom.length() - 2);
    border_bottom.append(" { border-bottom: 2px solid #000; } ");

    return border_bottom;
}